

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

int __thiscall
google::protobuf::RepeatedField<float>::SpaceUsedExcludingSelf(RepeatedField<float> *this)

{
  int iVar1;
  size_t size;
  
  size = 0;
  if (0 < (long)this->total_size_) {
    size = (long)this->total_size_ * 4 + 8;
  }
  iVar1 = internal::ToIntSize(size);
  return iVar1;
}

Assistant:

int SpaceUsedExcludingSelf() const {
    return internal::ToIntSize(SpaceUsedExcludingSelfLong());
  }